

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

char __thiscall
duckdb::Interpolator<true>::
Interpolate<unsigned_long,signed_char,duckdb::QuantileIndirect<signed_char>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<signed_char> *accessor)

{
  DataChunk *result_00;
  char input;
  CURSOR *pCVar1;
  bool bVar2;
  reference pvVar3;
  InvalidInputException *this_00;
  char input_00;
  char result_1;
  char local_41;
  string local_40;
  
  pCVar1 = accessor->data;
  if (((pCVar1->scan).next_row_index <= lidx) || (lidx < (pCVar1->scan).current_row_index)) {
    result_00 = &pCVar1->page;
    ColumnDataCollection::Seek(pCVar1->inputs,lidx,&pCVar1->scan,result_00);
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
    pCVar1->data = (char *)pvVar3->data;
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
    FlatVector::VerifyFlatVector(pvVar3);
    pCVar1->validity = &pvVar3->validity;
  }
  input = pCVar1->data[(uint)((int)lidx - (int)(pCVar1->scan).current_row_index)];
  bVar2 = TryCast::Operation<signed_char,signed_char>(input,&local_41,false);
  if (bVar2) {
    return local_41;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<signed_char,signed_char>(&local_40,(duckdb *)(ulong)(uint)(int)input,input_00);
  InvalidInputException::InvalidInputException(this_00,&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}